

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalGenerator::GetXcFrameworkFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *lang,string *config,
          cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  pointer pbVar1;
  bool bVar2;
  cmLocalGenerator *this_01;
  cmValue cVar3;
  cmComputeLinkInformation *this_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  cmValue cVar5;
  pointer dir;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view source;
  string *local_a0;
  string local_80;
  string local_60;
  pointer local_40;
  undefined8 local_38;
  
  this_01 = cmGeneratorTarget::GetLocalGenerator(target);
  this_00 = this_01->Makefile;
  bVar2 = cmGeneratorTarget::IsApple(target);
  if (bVar2) {
    local_60._M_dataplus._M_p = (pointer)0x13;
    local_60._M_string_length = 0x88e096;
    local_60.field_2._M_allocated_capacity = 0;
    local_40 = (lang->_M_dataplus)._M_p;
    local_60.field_2._8_8_ = lang->_M_string_length;
    local_38 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_60;
    cmCatViews(&local_80,views);
    local_a0 = (string *)cmMakefile::GetDefinition(this_00,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    local_60._M_dataplus._M_p = (pointer)0x1a;
    local_60._M_string_length = 0x88e0dd;
    local_60.field_2._M_allocated_capacity = 0;
    local_40 = (lang->_M_dataplus)._M_p;
    local_60.field_2._8_8_ = lang->_M_string_length;
    local_38 = 0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_60;
    cmCatViews(&local_80,views_00);
    cVar3 = cmMakefile::GetDefinition(this_00,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if ((local_a0 != (string *)0x0 || cVar3.Value != (string *)0x0) &&
       (this_02 = cmGeneratorTarget::GetLinkInformation(target,config),
       this_02 != (cmComputeLinkInformation *)0x0)) {
      pvVar4 = cmComputeLinkInformation::GetXcFrameworkHeaderPaths_abi_cxx11_(this_02);
      dir = (pvVar4->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (pvVar4->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (dir != pbVar1) {
        if (local_a0 == (string *)0x0) {
          local_a0 = &cmValue::Empty_abi_cxx11_;
        }
        do {
          if ((cVar3.Value == (string *)0x0) ||
             (bVar2 = cmGeneratorTarget::IsSystemIncludeDirectory(target,dir,config,lang),
             cVar5 = cVar3, !bVar2)) {
            cVar5.Value = local_a0;
          }
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)((cVar5.Value)->_M_dataplus)._M_p);
          source._M_str = (dir->_M_dataplus)._M_p;
          source._M_len = dir->_M_string_length;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&local_60,&this_01->super_cmOutputConverter,source,SHELL,false);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          dir = dir + 1;
        } while (dir != pbVar1);
      }
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetXcFrameworkFlags(std::string const& lang,
                                                  std::string const& config,
                                                  cmGeneratorTarget* target)
{
  cmLocalGenerator* lg = target->GetLocalGenerator();
  cmMakefile* mf = lg->GetMakefile();

  if (!target->IsApple()) {
    return std::string();
  }

  cmValue includeSearchFlag =
    mf->GetDefinition(cmStrCat("CMAKE_INCLUDE_FLAG_", lang));
  cmValue sysIncludeSearchFlag =
    mf->GetDefinition(cmStrCat("CMAKE_INCLUDE_SYSTEM_FLAG_", lang));

  if (!includeSearchFlag && !sysIncludeSearchFlag) {
    return std::string{};
  }

  std::string flags;
  if (cmComputeLinkInformation* cli = target->GetLinkInformation(config)) {
    std::vector<std::string> const& paths = cli->GetXcFrameworkHeaderPaths();
    for (std::string const& path : paths) {
      if (sysIncludeSearchFlag &&
          target->IsSystemIncludeDirectory(path, config, lang)) {
        flags += *sysIncludeSearchFlag;
      } else {
        flags += *includeSearchFlag;
      }
      flags += lg->ConvertToOutputFormat(path, cmOutputConverter::SHELL);
      flags += " ";
    }
  }
  return flags;
}